

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O2

void highs::parallel::initialize_scheduler(int numThreads)

{
  int iVar1;
  
  if (numThreads == 0) {
    iVar1 = std::thread::hardware_concurrency();
    HighsTaskExecutor::initialize(iVar1 + 1U >> 1);
    return;
  }
  HighsTaskExecutor::initialize(numThreads);
  return;
}

Assistant:

inline void initialize_scheduler(int numThreads = 0) {
  if (numThreads == 0) {
#ifdef HIGHS_NO_DEFAULT_THREADS
    numThreads = 1;
#else
    numThreads = (std::thread::hardware_concurrency() + 1) / 2;
#endif
  }
  HighsTaskExecutor::initialize(numThreads);
}